

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O2

Wln_Ntk_t * Wln_NtkAlloc(char *pName,int nObjsMax)

{
  int iVar1;
  Wln_Ntk_t *pWVar2;
  char *pcVar3;
  Wln_Vec_t *pWVar4;
  Hash_IntMan_t *p;
  Vec_Int_t *pVVar5;
  int Fill;
  int nCapMin;
  int nCapMin_00;
  
  pWVar2 = (Wln_Ntk_t *)calloc(1,0x458);
  if (pName == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = Extra_FileNameGeneric(pName);
  }
  pWVar2->pName = pcVar3;
  Vec_IntGrow(&pWVar2->vCis,0x6f);
  Vec_IntGrow(&pWVar2->vCos,0x6f);
  Vec_IntGrow(&pWVar2->vFfs,0x6f);
  nCapMin = nObjsMax + 1;
  Vec_IntGrow(&pWVar2->vTypes,nCapMin);
  Vec_StrGrow(&pWVar2->vSigns,nCapMin);
  Vec_IntGrow(&pWVar2->vRanges,nCapMin);
  Vec_IntPush(&pWVar2->vTypes,-1);
  iVar1 = (pWVar2->vSigns).nSize;
  if (iVar1 == (pWVar2->vSigns).nCap) {
    nCapMin_00 = 0x10;
    if (0xf < iVar1) {
      nCapMin_00 = iVar1 * 2;
    }
    Vec_StrGrow(&pWVar2->vSigns,nCapMin_00);
    iVar1 = (pWVar2->vSigns).nSize;
  }
  pcVar3 = (pWVar2->vSigns).pArray;
  (pWVar2->vSigns).nSize = iVar1 + 1;
  pcVar3[iVar1] = -1;
  Vec_IntPush(&pWVar2->vRanges,-1);
  pWVar4 = (Wln_Vec_t *)calloc((long)nCapMin,0x10);
  pWVar2->vFanins = pWVar4;
  p = (Hash_IntMan_t *)calloc(1,0x18);
  iVar1 = Abc_PrimeCudd(0x44c);
  pVVar5 = Vec_IntAlloc(iVar1);
  pVVar5->nSize = iVar1;
  if (pVVar5->pArray != (int *)0x0) {
    memset(pVVar5->pArray,0,(long)iVar1 << 2);
  }
  p->vTable = pVVar5;
  pVVar5 = Vec_IntAlloc(0x1130);
  p->vObjs = pVVar5;
  Vec_IntFill(pVVar5,4,Fill);
  p->nRefs = 1;
  pWVar2->pRanges = p;
  for (iVar1 = 0; iVar1 != 0x41; iVar1 = iVar1 + 1) {
    Hash_Int2ManInsert(p,iVar1,iVar1,(int)pcVar3);
  }
  for (iVar1 = 1; iVar1 != 0x40; iVar1 = iVar1 + 1) {
    Hash_Int2ManInsert(p,iVar1,0,(int)pcVar3);
  }
  if ((p->vObjs->nSize & 0xfffffffcU) == 0x204) {
    return pWVar2;
  }
  __assert_fail("Hash_IntManEntryNum(p->pRanges) == 128",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNtk.c"
                ,0x41,"Wln_Ntk_t *Wln_NtkAlloc(char *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creating networks.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Wln_Ntk_t * Wln_NtkAlloc( char * pName, int nObjsMax )
{
    Wln_Ntk_t * p; int i;
    p = ABC_CALLOC( Wln_Ntk_t, 1 );
    p->pName = pName ? Extra_FileNameGeneric( pName ) : NULL;
    Vec_IntGrow( &p->vCis, 111 );
    Vec_IntGrow( &p->vCos, 111 );
    Vec_IntGrow( &p->vFfs, 111 );
    Vec_IntGrow( &p->vTypes,  nObjsMax+1 );
    Vec_StrGrow( &p->vSigns,  nObjsMax+1 );
    Vec_IntGrow( &p->vRanges, nObjsMax+1 );
    Vec_IntPush( &p->vTypes,  -1 );
    Vec_StrPush( &p->vSigns,  -1 );
    Vec_IntPush( &p->vRanges, -1 );
    p->vFanins = ABC_CALLOC( Wln_Vec_t, nObjsMax+1 );
    p->pRanges = Hash_IntManStart( 1000 );
    for ( i = 0; i < 65; i++ )
        Hash_Int2ManInsert( p->pRanges, i, i, 0 );
    for ( i = 1; i < 64; i++ )
        Hash_Int2ManInsert( p->pRanges, i, 0, 0 );
    assert( Hash_IntManEntryNum(p->pRanges) == 128 );
    return p;
}